

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

alias_tensor_instance * __thiscall
dlib::alias_tensor::operator()
          (alias_tensor_instance *__return_storage_ptr__,alias_tensor *this,tensor *t,size_t offset)

{
  uint *puVar1;
  any *paVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar7;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string local_1c0;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  if ((this->inst).super_tensor.m_size + offset <= (ulong)t->m_size) {
    iVar6 = (*t->_vptr_tensor[10])(t);
    (this->inst).data_instance = (gpu_data *)CONCAT44(extraout_var,iVar6);
    iVar6 = (*t->_vptr_tensor[9])(t);
    (this->inst)._annotation = (any *)CONCAT44(extraout_var_00,iVar6);
    iVar6 = (*t->_vptr_tensor[0xc])(t);
    (this->inst).data_offset = CONCAT44(extraout_var_01,iVar6) + offset;
    lVar3 = (this->inst).super_tensor.m_k;
    lVar4 = (this->inst).super_tensor.m_nr;
    lVar5 = (this->inst).super_tensor.m_nc;
    (__return_storage_ptr__->super_tensor).m_n = (this->inst).super_tensor.m_n;
    (__return_storage_ptr__->super_tensor).m_k = lVar3;
    (__return_storage_ptr__->super_tensor).m_nr = lVar4;
    (__return_storage_ptr__->super_tensor).m_nc = lVar5;
    (__return_storage_ptr__->super_tensor).m_size = (this->inst).super_tensor.m_size;
    (__return_storage_ptr__->super_tensor)._vptr_tensor = (_func_int **)&PTR__tensor_001fa490;
    __return_storage_ptr__->data_offset = (this->inst).data_offset;
    paVar2 = (this->inst)._annotation;
    __return_storage_ptr__->data_instance = (this->inst).data_instance;
    __return_storage_ptr__->_annotation = paVar2;
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\n\nError detected at line ",0x19);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x272);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/tensor.h"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "alias_tensor_instance dlib::alias_tensor::operator()(tensor &, size_t) const",0x4c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"offset+size() <= t.size()",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"offset: ",8);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"size(): ",8);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"t.size(): ",10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1c0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

alias_tensor_instance operator() (
            tensor& t,
            size_t offset = 0
        ) const
        {
            DLIB_CASSERT(offset+size() <= t.size(), 
                "offset: "<<offset <<"\n"<<
                "size(): "<<size() <<"\n"<<
                "t.size(): "<<t.size() <<"\n");

#ifdef DLIB_USE_CUDA
            if (!inst.cudnn_descriptor)
            {
                inst.cudnn_descriptor = std::make_shared<cuda::tensor_descriptor>();
                inst.cudnn_descriptor->set_size(inst.m_n, inst.m_k, inst.m_nr, inst.m_nc);
            }
#endif
            inst.data_instance = &t.data();
            inst._annotation   = &t.annotation();
            // Note that t might already be an aliasing tensor so we need to take that into
            // account.
            inst.data_offset = t.get_alias_offset()+offset;
            return inst;
        }